

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

Value * duckdb::HTTPProxySetting::GetSetting(Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  ::std::__cxx11::string::string((string *)&local_30,(string *)&(pDVar1->options).http_proxy);
  Value::Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value HTTPProxySetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return Value(config.options.http_proxy);
}